

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tutorial_device.cpp
# Opt level: O1

Vec2f __thiscall
embree::getTextureCoordinatesSubdivMesh(embree *this,void *_mesh,uint primID,float u,float v)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  uint uVar4;
  int iVar5;
  long lVar6;
  long lVar7;
  Vec2f VVar8;
  Vec2f *st;
  float in_XMM0_Db;
  float fVar9;
  undefined8 uVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  
  *(float *)this = u;
  *(float *)(this + 4) = v;
  if ((_mesh != (void *)0x0) && (lVar6 = *(long *)((long)_mesh + 0x40), lVar6 != 0)) {
    uVar4 = *(uint *)(*(long *)((long)_mesh + 0x90) + (ulong)primID * 4);
    iVar5 = *(int *)(*(long *)((long)_mesh + 0x58) + (ulong)primID * 4);
    if (iVar5 == 4) {
      lVar7 = *(long *)((long)_mesh + 0x28);
      fVar13 = (1.0 - u) * (1.0 - v);
      fVar12 = (1.0 - v) * u;
      fVar9 = u * v;
      fVar11 = (1.0 - u) * v;
      uVar10 = *(undefined8 *)(lVar7 + (ulong)*(uint *)(lVar6 + (ulong)uVar4 * 4) * 8);
      uVar1 = *(undefined8 *)(lVar7 + (ulong)*(uint *)(lVar6 + (ulong)(uVar4 + 1) * 4) * 8);
      uVar2 = *(undefined8 *)(lVar7 + (ulong)*(uint *)(lVar6 + (ulong)(uVar4 + 2) * 4) * 8);
      uVar3 = *(undefined8 *)(lVar7 + (ulong)*(uint *)(lVar6 + (ulong)(uVar4 + 3) * 4) * 8);
      u = fVar9 * (float)uVar2 + fVar12 * (float)uVar1 + fVar13 * (float)uVar10;
      in_XMM0_Db = fVar9 * (float)((ulong)uVar2 >> 0x20) +
                   fVar12 * (float)((ulong)uVar1 >> 0x20) + fVar13 * (float)((ulong)uVar10 >> 0x20);
      uVar10 = CONCAT44(fVar11 * (float)((ulong)uVar3 >> 0x20) + in_XMM0_Db,
                        fVar11 * (float)uVar3 + u);
    }
    else {
      if (iVar5 != 3) goto LAB_0013a03e;
      lVar7 = *(long *)((long)_mesh + 0x28);
      fVar11 = (1.0 - u) - v;
      uVar10 = *(undefined8 *)(lVar7 + (ulong)*(uint *)(lVar6 + (ulong)uVar4 * 4) * 8);
      uVar1 = *(undefined8 *)(lVar7 + (ulong)*(uint *)(lVar6 + (ulong)(uVar4 + 1) * 4) * 8);
      uVar2 = *(undefined8 *)(lVar7 + (ulong)*(uint *)(lVar6 + (ulong)(uVar4 + 2) * 4) * 8);
      fVar9 = u * (float)((ulong)uVar1 >> 0x20);
      u = u * (float)uVar1 + fVar11 * (float)uVar10;
      in_XMM0_Db = fVar9 + fVar11 * (float)((ulong)uVar10 >> 0x20);
      uVar10 = CONCAT44(v * (float)((ulong)uVar2 >> 0x20) + in_XMM0_Db,v * (float)uVar2 + u);
    }
    *(undefined8 *)this = uVar10;
  }
LAB_0013a03e:
  VVar8.field_0.field_0.y = in_XMM0_Db;
  VVar8.field_0.field_0.x = u;
  return (Vec2f)VVar8.field_0;
}

Assistant:

Vec2f getTextureCoordinatesSubdivMesh(void* _mesh, const unsigned int primID, const float u, const float v)
{
  ISPCSubdivMesh *mesh = (ISPCSubdivMesh *)_mesh;
  Vec2f st;
  st.x = u;
  st.y = v;
  if (mesh && mesh->texcoord_indices)
    {
      assert(primID < mesh->numFaces);
      const unsigned int face_offset = mesh->face_offsets[primID];
      if (mesh->verticesPerFace[primID] == 3)
	{
	  const unsigned int t0 = mesh->texcoord_indices[face_offset+0];
	  const unsigned int t1 = mesh->texcoord_indices[face_offset+1];
	  const unsigned int t2 = mesh->texcoord_indices[face_offset+2];
	  const Vec2f txt0 = mesh->texcoords[t0];
	  const Vec2f txt1 = mesh->texcoords[t1];
	  const Vec2f txt2 = mesh->texcoords[t2];
	  const float w = 1.0f - u - v;
	  st = w * txt0 + u * txt1 + v * txt2;
	}
      else if (mesh->verticesPerFace[primID] == 4)
	{
	  const unsigned int t0 = mesh->texcoord_indices[face_offset+0];
	  const unsigned int t1 = mesh->texcoord_indices[face_offset+1];
	  const unsigned int t2 = mesh->texcoord_indices[face_offset+2];
	  const unsigned int t3 = mesh->texcoord_indices[face_offset+3];
	  const Vec2f txt0 = mesh->texcoords[t0];
	  const Vec2f txt1 = mesh->texcoords[t1];
	  const Vec2f txt2 = mesh->texcoords[t2];
	  const Vec2f txt3 = mesh->texcoords[t3];
	  const float u0 = u;
	  const float v0 = v;
	  const float u1 = 1.0f - u;
	  const float v1 = 1.0f - v;
	  st = u1*v1 * txt0 + u0*v1* txt1 + u0*v0 * txt2 + u1*v0* txt3;
	}
    }
  return st;
}